

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

int assetsys_file_size(assetsys_t *sys,assetsys_file_t file)

{
  char *__dest;
  assetsys_internal_mount_t *paVar1;
  int iVar2;
  strpool_internal_entry_t *psVar3;
  char *__src;
  long lVar4;
  stat local_c0;
  
  if ((long)sys->mounts_count < 1) {
    return 0;
  }
  paVar1 = sys->mounts;
  lVar4 = 0;
  while ((*(unsigned_long_long *)((long)&paVar1->mounted_as + lVar4) != file.mount ||
         (*(unsigned_long_long *)((long)&paVar1->path + lVar4) != file.path))) {
    lVar4 = lVar4 + 0x98;
    if ((long)sys->mounts_count * 0x98 - lVar4 == 0) {
      return 0;
    }
  }
  if (*(int *)((long)&paVar1->type + lVar4) == 0) {
    __dest = sys->temp;
    psVar3 = strpool_internal_get_entry
                       (&sys->strpool,*(unsigned_long_long *)((long)&paVar1->path + lVar4));
    strcpy(__dest,psVar3->data + 8);
    __src = "/";
    if (sys->temp[0] == '\0') {
      __src = "";
    }
    strcat(__dest,__src);
    psVar3 = strpool_internal_get_entry
                       (&sys->strpool,
                        sys->collated
                        [*(int *)(*(long *)((long)&paVar1->files + lVar4) + 8 +
                                 (long)file.index * 0xc)].path);
    strcat(__dest,psVar3->data + (long)*(int *)((long)&paVar1->mount_len + lVar4) + 9);
    iVar2 = stat(__dest,&local_c0);
    if (iVar2 == 0) {
      *(undefined4 *)(*(long *)((long)&paVar1->files + lVar4) + (long)file.index * 0xc) =
           (undefined4)local_c0.st_size;
    }
  }
  return *(int *)(*(long *)((long)&paVar1->files + lVar4) + (long)file.index * 0xc);
}

Assistant:

int assetsys_file_size( assetsys_t* sys, assetsys_file_t file )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, file.mount, file.path );
    if( mount_index < 0 ) return 0;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ mount->files[ file.index ].collated_index ].path ) + mount->mount_len + 1 );
        struct stat s;
        if( stat( sys->temp, &s ) == 0 )
            mount->files[ file.index ].size = (int) s.st_size;
        }
        
    return mount->files[ file.index ].size;
    }